

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

decoder_tables * __thiscall
crnd::prefix_coding::decoder_tables::operator=(decoder_tables *this,decoder_tables *other)

{
  uint *puVar1;
  uint uVar2;
  
  if (this != other) {
    if (this->m_lookup != (uint32 *)0x0) {
      crnd_free(this->m_lookup + -2);
      this->m_lookup = (uint32 *)0x0;
      this->m_cur_lookup_size = 0;
    }
    if (this->m_sorted_symbol_order != (uint16 *)0x0) {
      crnd_free(this->m_sorted_symbol_order + -4);
      this->m_sorted_symbol_order = (uint16 *)0x0;
      this->m_cur_sorted_symbol_order_size = 0;
    }
    memcpy(this,other,0xc0);
    if (other->m_lookup != (uint32 *)0x0) {
      uVar2 = this->m_cur_lookup_size + (uint)(this->m_cur_lookup_size == 0);
      puVar1 = (uint *)crnd_malloc((ulong)uVar2 * 4 + 8,(size_t *)0x0);
      if (puVar1 == (uint *)0x0) {
        this->m_lookup = (uint32 *)0x0;
      }
      else {
        puVar1[1] = uVar2;
        *puVar1 = ~uVar2;
        this->m_lookup = puVar1 + 2;
        memcpy(puVar1 + 2,other->m_lookup,(ulong)this->m_cur_lookup_size << 2);
      }
    }
    if (other->m_sorted_symbol_order != (uint16 *)0x0) {
      uVar2 = this->m_cur_sorted_symbol_order_size +
              (uint)(this->m_cur_sorted_symbol_order_size == 0);
      puVar1 = (uint *)crnd_malloc((ulong)uVar2 * 2 + 8,(size_t *)0x0);
      if (puVar1 == (uint *)0x0) {
        this->m_sorted_symbol_order = (uint16 *)0x0;
      }
      else {
        puVar1[1] = uVar2;
        *puVar1 = ~uVar2;
        this->m_sorted_symbol_order = (uint16 *)(puVar1 + 2);
        memcpy(puVar1 + 2,other->m_sorted_symbol_order,
               (ulong)this->m_cur_sorted_symbol_order_size * 2);
      }
    }
  }
  return this;
}

Assistant:

decoder_tables& operator=(const decoder_tables& other)
            {
                if (this == &other)
                    return *this;

                clear();

                memcpy(this, &other, sizeof(*this));

                if (other.m_lookup)
                {
                    m_lookup = crnd_new_array<uint32>(m_cur_lookup_size);
                    if (m_lookup)
                        memcpy(m_lookup, other.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
                }

                if (other.m_sorted_symbol_order)
                {
                    m_sorted_symbol_order = crnd_new_array<uint16>(m_cur_sorted_symbol_order_size);
                    if (m_sorted_symbol_order)
                        memcpy(m_sorted_symbol_order, other.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
                }

                return *this;
            }